

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_mtbdd.c
# Opt level: O3

void mtbdd_gc_mark_protected_WRAP(WorkerP *w,Task *__dq_head,TD_mtbdd_gc_mark_protected *t)

{
  undefined8 uVar1;
  Worker *pWVar2;
  Task *pTVar3;
  undefined8 *puVar4;
  uint uVar5;
  Task *__dq_head_00;
  long lVar6;
  long lVar7;
  uint64_t *puStack_38;
  
  puStack_38 = protect_iter(&mtbdd_protected,0,mtbdd_protected.refs_size);
  if (puStack_38 != (uint64_t *)0x0) {
    lVar6 = (long)__dq_head << 0x1a;
    lVar7 = 0;
    pTVar3 = __dq_head;
    do {
      __dq_head_00 = pTVar3;
      puVar4 = (undefined8 *)protect_next(&mtbdd_protected,&puStack_38,mtbdd_protected.refs_size);
      if (__dq_head_00 == w->end) {
        lace_abort_stack_overflow();
      }
      uVar1 = *puVar4;
      __dq_head_00->f = mtbdd_gc_mark_rec_WRAP;
      __dq_head_00->thief = (_Worker *)0x1;
      *(undefined8 *)__dq_head_00->d = uVar1;
      pWVar2 = w->_public;
      if (w->allstolen == '\0') {
        if (pWVar2->movesplit != '\0') {
          uVar5 = (uint)((int)((ulong)((long)__dq_head - (long)w->dq) >> 6) + 2 +
                        (int)((ulong)((long)w->split - (long)w->dq) >> 6)) >> 1;
          LOCK();
          (pWVar2->ts).ts.split = uVar5;
          UNLOCK();
          w->split = w->dq + uVar5;
          pWVar2->movesplit = '\0';
        }
      }
      else {
        if (pWVar2->movesplit != '\0') {
          pWVar2->movesplit = '\0';
        }
        LOCK();
        (pWVar2->ts).v =
             (lVar6 + (long)w->dq * -0x4000000 & 0xffffffff00000000U) + 0x100000000 |
             (ulong)((long)__dq_head - (long)w->dq) >> 6 & 0xffffffff;
        UNLOCK();
        pWVar2->allstolen = '\0';
        w->split = __dq_head_00 + 1;
        w->allstolen = '\0';
      }
      __dq_head = __dq_head + 1;
      lVar7 = lVar7 + -1;
      lVar6 = lVar6 + 0x100000000;
      pTVar3 = __dq_head_00 + 1;
    } while (puStack_38 != (uint64_t *)0x0);
    puStack_38 = (uint64_t *)0x0;
    for (; lVar7 != 0; lVar7 = lVar7 + 1) {
      if ((w->_public->movesplit == '\0') && (w->split <= __dq_head_00)) {
        __dq_head_00->thief = (_Worker *)0x0;
        mtbdd_gc_mark_rec_CALL(w,__dq_head_00,*(MDD *)__dq_head_00->d);
      }
      else {
        mtbdd_gc_mark_rec_SYNC_SLOW(w,__dq_head_00);
      }
      __dq_head_00 = __dq_head_00 + -1;
    }
  }
  return;
}

Assistant:

VOID_TASK_0(mtbdd_gc_mark_protected)
{
    // iterate through refs hash table, mark all found
    size_t count=0;
    uint64_t *it = protect_iter(&mtbdd_protected, 0, mtbdd_protected.refs_size);
    while (it != NULL) {
        BDD *to_mark = (BDD*)protect_next(&mtbdd_protected, &it, mtbdd_protected.refs_size);
        SPAWN(mtbdd_gc_mark_rec, *to_mark);
        count++;
    }
    while (count--) {
        SYNC(mtbdd_gc_mark_rec);
    }
}